

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O1

string * __thiscall
cmGeneratorExpressionEvaluationFile::FixRelativePath
          (string *__return_storage_ptr__,cmGeneratorExpressionEvaluationFile *this,
          string *relativePath,PathRole role,cmLocalGenerator *lg)

{
  PolicyStatus PVar1;
  string *psVar2;
  ostream *poVar3;
  char *pcVar4;
  PolicyID id;
  string arg;
  ostringstream w;
  string local_1e8;
  char *local_1c8;
  long local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  PVar1 = this->PolicyStatusCMP0070;
  if (PVar1 - NEW < 3) {
    if (role == PathForOutput) {
      psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(lg);
      cmsys::SystemTools::CollapseFullPath((string *)local_1a8,relativePath,psVar2);
    }
    else {
      if (role != PathForInput) {
        return __return_storage_ptr__;
      }
      psVar2 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(lg);
      cmsys::SystemTools::CollapseFullPath((string *)local_1a8,relativePath,psVar2);
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
      return __return_storage_ptr__;
    }
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    return __return_storage_ptr__;
  }
  if (PVar1 == OLD) goto LAB_00369cfb;
  if (PVar1 != WARN) {
    return __return_storage_ptr__;
  }
  local_1c0 = 0;
  local_1b8 = '\0';
  local_1c8 = &local_1b8;
  if (role == PathForOutput) {
    pcVar4 = "OUTPUT";
LAB_00369bdf:
    std::__cxx11::string::_M_replace((ulong)&local_1c8,0,(char *)0x0,(ulong)pcVar4);
  }
  else if (role == PathForInput) {
    pcVar4 = "INPUT";
    goto LAB_00369bdf;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e8,(cmPolicies *)0x46,id);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nfile(GENERATE) given relative ",0x1f)
  ;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_1c8,local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," path:\n  ",9);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(relativePath->_M_dataplus)._M_p,relativePath->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "\nThis is not defined behavior unless CMP0070 is set to NEW.  For compatibility with older versions of CMake, the previous undefined behavior will be used."
             ,0x9a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  cmLocalGenerator::IssueMessage(lg,AUTHOR_WARNING,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
LAB_00369cfb:
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpressionEvaluationFile::FixRelativePath(
  std::string const& relativePath, PathRole role, cmLocalGenerator* lg)
{
  std::string resultPath;
  switch (this->PolicyStatusCMP0070) {
    case cmPolicies::WARN: {
      std::string arg;
      switch (role) {
        case PathForInput:
          arg = "INPUT";
          break;
        case PathForOutput:
          arg = "OUTPUT";
          break;
      }
      std::ostringstream w;
      /* clang-format off */
      w <<
        cmPolicies::GetPolicyWarning(cmPolicies::CMP0070) << "\n"
        "file(GENERATE) given relative " << arg << " path:\n"
        "  " << relativePath << "\n"
        "This is not defined behavior unless CMP0070 is set to NEW.  "
        "For compatibility with older versions of CMake, the previous "
        "undefined behavior will be used."
        ;
      /* clang-format on */
      lg->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
    }
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // OLD behavior is to use the relative path unchanged,
      // which ends up being used relative to the working dir.
      resultPath = relativePath;
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // NEW behavior is to interpret the relative path with respect
      // to the current source or binary directory.
      switch (role) {
        case PathForInput:
          resultPath = cmSystemTools::CollapseFullPath(
            relativePath, lg->GetCurrentSourceDirectory());
          break;
        case PathForOutput:
          resultPath = cmSystemTools::CollapseFullPath(
            relativePath, lg->GetCurrentBinaryDirectory());
          break;
      }
      break;
  }
  return resultPath;
}